

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Type __thiscall wasm::TranslateToFuzzReader::getSuperType(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Nullability nullable;
  HeapType HVar2;
  Type local_38;
  Type type_local;
  Type local_28;
  
  local_38.id = type.id;
  HVar2 = Type::getHeapType(&local_38);
  HVar2 = getSuperType(this,HVar2);
  nullable = getSuperType(this,(uint)(((uint)local_38.id & 3) == 2 && 6 < local_38.id));
  Type::Type(&local_28,HVar2,nullable,Inexact);
  bVar1 = GCTypeUtils::isUninhabitable(local_28);
  if (bVar1) {
    Type::Type(&type_local,HVar2,Nullable,Inexact);
    local_28 = type_local;
  }
  return (Type)local_28.id;
}

Assistant:

Type TranslateToFuzzReader::getSuperType(Type type) {
  auto heapType = getSuperType(type.getHeapType());
  auto nullability = getSuperType(type.getNullability());
  auto superType = Type(heapType, nullability);
  // As with getSubType, we want to avoid returning an uninhabitable type where
  // possible. Here all we can do is flip the super's nullability to nullable.
  if (GCTypeUtils::isUninhabitable(superType)) {
    superType = Type(heapType, Nullable);
  }
  return superType;
}